

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::resizeEvent(QWizard *this,QResizeEvent *event)

{
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = *(QSize *)(event + 0x10);
  QWidget::resize(*(QWidget **)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x468),
                  &local_20);
  QDialog::resizeEvent(&this->super_QDialog,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::resizeEvent(QResizeEvent *event)
{
    Q_D(QWizard);
    int heightOffset = 0;
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled()) {
        heightOffset = d->vistaHelper->topOffset(this);
        heightOffset += d->vistaHelper->titleBarSize();
    }
#endif
    d->antiFlickerWidget->resize(event->size().width(), event->size().height() - heightOffset);
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled())
        d->vistaHelper->resizeEvent(event);
#endif
    QDialog::resizeEvent(event);
}